

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O2

WeightLitsRep *
Clasp::WeightLitsRep::create
          (WeightLitsRep *__return_storage_ptr__,Solver *s,WeightLitVec *lits,weight_t bound)

{
  uint *puVar1;
  pointer ppVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  pair<Clasp::Literal,_int> *ppVar6;
  int iVar7;
  WeightLiteral *pWVar8;
  char *exp;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32 uVar12;
  ulong uVar13;
  ulong uVar14;
  char *fmt;
  uint uVar15;
  uint uVar16;
  
  if (((s->assign_).assign_.ebo_.size - 1 < (s->shared_->varInfo_).ebo_.size - 1) &&
     (uVar5 = (ulong)(lits->ebo_).size, uVar5 != 0)) {
    ppVar2 = (lits->ebo_).buf;
    ppVar6 = std::__max_element<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_less_iter>
                       (ppVar2,ppVar2 + uVar5);
    Solver::acquireProblemVar(s,(ppVar6->first).rep_ >> 2);
  }
  uVar10 = 0;
  uVar5 = 0;
  do {
    uVar9 = (uint)uVar5;
    ppVar2 = (lits->ebo_).buf;
    if (uVar10 == (lits->ebo_).size) {
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      erase(lits,ppVar2 + uVar5,ppVar2 + uVar10);
      uVar10 = 1;
      uVar9 = 1;
      if (1 < bound) {
        uVar9 = bound;
      }
      ppVar6 = (lits->ebo_).buf;
      puVar3 = (s->assign_).assign_.ebo_.buf;
      uVar11 = 0x7fffffff;
      uVar16 = 0;
      uVar12 = 0;
      while( true ) {
        uVar5 = (ulong)uVar12;
        if (uVar12 == (lits->ebo_).size) {
          if (uVar10 == uVar11) {
            if (uVar11 != 1) {
              ppVar2 = (lits->ebo_).buf;
              for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
                ppVar2[uVar13].second = 1;
              }
              bound = (int)(uVar11 + bound + -1) / (int)uVar11;
              uVar16 = (int)(uVar11 + uVar16 + -1) / (int)uVar11;
            }
          }
          else {
            std::
            __stable_sort<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>>
                      (ppVar6,ppVar6 + uVar5,
                       (_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>_>_>
                        )SUB83(__return_storage_ptr__,0));
            uVar12 = (lits->ebo_).size;
          }
          if (uVar12 == 0) {
            pWVar8 = (WeightLiteral *)0x0;
          }
          else {
            pWVar8 = (lits->ebo_).buf;
          }
          __return_storage_ptr__->lits = pWVar8;
          __return_storage_ptr__->size = uVar12;
          __return_storage_ptr__->bound = bound;
          __return_storage_ptr__->reach = uVar16;
          return __return_storage_ptr__;
        }
        puVar1 = (uint *)((long)puVar3 + (ulong)(ppVar6[uVar5].first.rep_ & 0xfffffffc));
        *puVar1 = *puVar1 & 0xfffffff3;
        uVar4 = ppVar6[uVar5].second;
        if ((int)uVar10 < (int)uVar4) {
          if ((int)uVar9 < (int)uVar4) {
            uVar4 = uVar9;
          }
          ppVar6[uVar5].second = uVar4;
          uVar10 = uVar4;
        }
        if ((int)(uVar16 ^ 0x7fffffff) < (int)uVar4) break;
        if ((int)uVar4 < (int)uVar11) {
          uVar11 = uVar4;
        }
        uVar16 = uVar16 + uVar4;
        uVar12 = uVar12 + 1;
      }
      exp = "(MAX_W - sumW) >= lits[i].second";
      fmt = "Sum of weights out of range";
      iVar7 = 0x4b;
      uVar10 = 0x62;
LAB_001720c8:
      Potassco::fail(iVar7,
                     "static WeightLitsRep Clasp::WeightLitsRep::create(Solver &, WeightLitVec &, weight_t)"
                     ,uVar10,exp,fmt,0);
    }
    uVar11 = ppVar2[uVar10].first.rep_;
    uVar16 = ppVar2[uVar10].second;
    uVar4 = uVar11 & 0xfffffffe;
    ppVar2[uVar10].first.rep_ = uVar4;
    puVar3 = (s->assign_).assign_.ebo_.buf;
    if ((uVar16 == 0) || (puVar3[uVar11 >> 2] < 0x10 && (puVar3[uVar11 >> 2] & 3) != 0)) {
      if ((byte)((byte)puVar3[uVar11 >> 2] & 3) != (byte)(2U - ((uVar11 & 2) == 0))) {
        uVar16 = 0;
      }
      bound = bound - uVar16;
    }
    else {
      if ((int)uVar16 < 0) {
        uVar11 = -uVar16;
        ppVar2[uVar10].second = uVar11;
        uVar4 = uVar4 ^ 2;
        ppVar2[uVar10].first.rep_ = uVar4;
        if ((-1 < bound) && ((bound ^ 0x7fffffffU) < uVar11)) {
          exp = "bound < 0 || (MAX_W-bound) >= lits[i].second";
          fmt = "bound out of range";
          iVar7 = -2;
          uVar10 = 0x38;
          goto LAB_001720c8;
        }
        bound = bound - uVar16;
        uVar16 = uVar11;
      }
      uVar15 = uVar4 >> 2;
      uVar11 = *(uint *)((long)puVar3 + (ulong)(uVar4 & 0xfffffffc));
      if ((uVar11 & 0xc) == 0) {
        if (uVar10 != uVar9) {
          ppVar2[uVar5].first.rep_ = uVar4;
          ppVar2[uVar5].second = uVar16;
          uVar11 = puVar3[uVar15];
        }
        puVar3[uVar15] = (uVar4 & 2) * 2 + 4 | uVar11;
        uVar5 = (ulong)(uVar9 + 1);
      }
      else if ((uVar11 & (uint)((uVar4 & 2) == 0) * 4 + 4) == 0) {
        uVar11 = 0;
        do {
          uVar13 = uVar5;
          if (uVar9 == uVar11) break;
          uVar13 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
        } while (1 < (ppVar2[uVar13].first.rep_ ^ uVar4));
        ppVar2[uVar13].second = ppVar2[uVar13].second + uVar16;
      }
      else {
        for (uVar13 = 0; uVar14 = uVar5, uVar11 = uVar9, uVar5 != uVar13; uVar13 = uVar13 + 1) {
          if ((ppVar2[uVar13].first.rep_ ^ uVar4 ^ 2) < 2) {
            uVar14 = uVar13;
            uVar11 = (uint)uVar13;
            break;
          }
        }
        bound = bound - uVar16;
        ppVar2 = ppVar2 + uVar14;
        iVar7 = ppVar2->second - uVar16;
        ppVar2->second = iVar7;
        if (iVar7 < 0) {
          (ppVar2->first).rep_ = uVar4;
          ppVar2->second = -iVar7;
          puVar3[uVar15] = (puVar3[uVar15] & 0xfffffff3) + (uVar4 & 2) * 2 + 4;
          bound = bound + ppVar2->second;
        }
        else if (iVar7 == 0) {
          *(byte *)(puVar3 + uVar15) = (byte)puVar3[uVar15] & 0xf3;
          memmove(ppVar2,ppVar2 + 1,(ulong)(~uVar11 + uVar9) << 3);
          uVar5 = (ulong)(uVar9 - 1);
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

WeightLitsRep WeightLitsRep::create(Solver& s, WeightLitVec& lits, weight_t bound) {
	// Step 0: Ensure s has all relevant problem variables
	if (s.numProblemVars() > s.numVars() && !lits.empty()) {
		s.acquireProblemVar(std::max_element(lits.begin(), lits.end())->first.var());
	}
	// Step 1: remove assigned/superfluous literals and merge duplicate/complementary ones
	LitVec::size_type j = 0, other;
	const weight_t MAX_W= std::numeric_limits<weight_t>::max();
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		Literal x = lits[i].first.unflag();
		if (lits[i].second != 0 && s.topValue(x.var()) == value_free) {
			if (lits[i].second < 0) {
				lits[i].second = -lits[i].second;
				lits[i].first  = x = ~lits[i].first;
				POTASSCO_REQUIRE(bound < 0 || (MAX_W-bound) >= lits[i].second, "bound out of range");
				bound         += lits[i].second;
			}
			if (!s.seen(x.var())) { // first time we see x, keep and mark x
				if (i != j) lits[j] = lits[i];
				s.markSeen(x);
				++j;
			}
			else if (!s.seen(~x)) { // multi-occurrences of x, merge
				for (other = 0; other != j && lits[other].first != x; ++other) { ; }
				lits[other].second += lits[i].second;
			}
			else {                  // complementary literals ~x x
				for (other = 0; other != j && lits[other].first != ~x; ++other) { ; }
				bound              -= lits[i].second; // decrease by min(w(~x), w(x)) ; assume w(~x) > w(x)
				lits[other].second -= lits[i].second; // keep ~x,
				if (lits[other].second < 0) {         // actually, w(x) > w(~x),
					lits[other].first  = x;             // replace ~x with x
					lits[other].second = -lits[other].second;
					s.clearSeen(x.var());
					s.markSeen(x);
					bound += lits[other].second;        // and correct the bound
				}
				else if (lits[other].second == 0) {   // w(~x) == w(x) - drop both lits
					s.clearSeen(x.var());
					std::memmove(&lits[0]+other, &lits[0]+other+1, (j-other-1)*sizeof(lits[other]));
					--j;
				}
			}
		}
		else if (s.isTrue(x)) { bound -= lits[i].second; }
	}
	lits.erase(lits.begin()+j, lits.end());
	// Step 2: compute min,max, achievable weight and clear flags set in step 1
	weight_t sumW = 0;
	weight_t minW = MAX_W, maxW = 1;
	weight_t B    = std::max(bound, 1);
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		assert(lits[i].second > 0);
		s.clearSeen(lits[i].first.var());
		if (lits[i].second > maxW) { maxW = lits[i].second = std::min(lits[i].second, B);  }
		if (lits[i].second < minW) { minW = lits[i].second; }
		POTASSCO_CHECK((MAX_W - sumW) >= lits[i].second, EOVERFLOW, "Sum of weights out of range");
		sumW += lits[i].second;
	}
	// Step 3: sort by decreasing weight
	if (maxW != minW) {
		std::stable_sort(lits.begin(), lits.end(), compose22(
			std::greater<weight_t>(),
			select2nd<WeightLiteral>(),
			select2nd<WeightLiteral>()));
	}
	else if (minW != 1) {
		// disguised cardinality constraint
		bound = (bound+(minW-1))/minW;
		sumW  = (sumW+(minW-1))/minW;
		for (LitVec::size_type i = 0; i != lits.size(); ++i) { lits[i].second = 1; }
	}
	WeightLitsRep result = { !lits.empty() ? &lits[0] : 0, (uint32)lits.size(), bound, sumW };
	return result;
}